

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_convolve_x_sr_intrabc_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  uint8_t uVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int32_t res;
  int x;
  int y;
  undefined4 local_2c;
  undefined4 local_28;
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_28 = 0; local_28 < in_R9D; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < in_R8D; local_2c = local_2c + 1) {
      uVar1 = clip_pixel((int)((uint)*(byte *)(local_8 + local_2c) +
                               (uint)*(byte *)(local_8 + (local_2c + 1)) + 1) >> 1);
      *(uint8_t *)(local_18 + local_2c) = uVar1;
    }
    local_8 = local_8 + in_ESI;
    local_18 = local_18 + in_ECX;
  }
  return;
}

Assistant:

void av1_convolve_x_sr_intrabc_c(const uint8_t *src, int src_stride,
                                 uint8_t *dst, int dst_stride, int w, int h,
                                 const InterpFilterParams *filter_params_x,
                                 const int subpel_x_qn,
                                 ConvolveParams *conv_params) {
  assert(subpel_x_qn == 8);
  assert(filter_params_x->taps == 2);
  assert((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS);
  (void)filter_params_x;
  (void)subpel_x_qn;
  (void)conv_params;

  // horizontal filter
  // explicitly operate for subpel_x_qn = 8.
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t res = src[x] + src[x + 1];
      dst[x] = clip_pixel(ROUND_POWER_OF_TWO(res, 1));
    }
    src += src_stride;
    dst += dst_stride;
  }
}